

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O1

void __thiscall FIX::Header::Header(Header *this)

{
  message_order mStack_28;
  
  mStack_28.m_groupOrder.m_buffer._0_4_ = 0;
  mStack_28._20_8_ = 0;
  mStack_28.m_mode = header;
  mStack_28.m_delim = 0;
  mStack_28.m_groupOrder.m_size._0_4_ = 0;
  mStack_28.m_groupOrder.m_size._4_4_ = 0;
  FIX::FieldMap::FieldMap(&this->super_FieldMap,&mStack_28,8);
  shared_array<int>::release(&mStack_28.m_groupOrder);
  *(undefined ***)this = &PTR__FieldMap_00326928;
  return;
}

Assistant:

Header() : FieldMap( message_order( message_order::header ), REQUIRED_FIELDS )
  {}